

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O1

void slang::ast::Expression::findPotentiallyImplicitNets
               (SyntaxNode *expr,ASTContext *context,
               SmallVectorBase<const_slang::syntax::IdentifierNameSyntax_*> *results)

{
  Visitor visitor;
  Visitor local_10;
  
  local_10.context = context;
  local_10.results = results;
  slang::syntax::detail::
  visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::ast::Expression::findPotentiallyImplicitNets(slang::syntax::SyntaxNode_const&,slang::ast::ASTContext_const&,slang::SmallVectorBase<slang::syntax::IdentifierNameSyntax_const*>&)::Visitor>
            (expr,&local_10);
  return;
}

Assistant:

void Expression::findPotentiallyImplicitNets(
    const SyntaxNode& expr, const ASTContext& context,
    SmallVectorBase<const IdentifierNameSyntax*>& results) {

    struct Visitor : public SyntaxVisitor<Visitor> {
        Visitor(const ASTContext& context, SmallVectorBase<const IdentifierNameSyntax*>& results) :
            context(context), results(results) {}

        void handle(const NameSyntax& nameSyntax) {
            if (nameSyntax.kind != SyntaxKind::IdentifierName)
                return;

            bitmask<LookupFlags> flags = LookupFlags::NoUndeclaredError;
            if (context.flags.has(ASTFlags::BindInstantiation))
                flags |= LookupFlags::DisallowWildcardImport | LookupFlags::DisallowUnitReferences;

            LookupResult result;
            ASTContext ctx(*context.scope, LookupLocation::max);
            Lookup::name(nameSyntax, ctx, flags, result);

            SLANG_ASSERT(!result.flags.has(LookupResultFlags::IsHierarchical));

            if (!result.found && !result.hasError())
                results.push_back(&nameSyntax.as<IdentifierNameSyntax>());
        }

        const ASTContext& context;
        SmallVectorBase<const IdentifierNameSyntax*>& results;
    };

    Visitor visitor(context, results);
    expr.visit(visitor);
}